

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall vera::Scene::setStreamsPlay(Scene *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->streams)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 2) + 0xf8))();
  }
  return;
}

Assistant:

void Scene::setStreamsPlay() {
    for (TextureStreamsMap::iterator it = streams.begin(); it != streams.end(); ++it)
        it->second->play();
}